

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxIfStatement::Resolve(FxIfStatement *this,FCompileContext *ctx)

{
  FxExpression **ppFVar1;
  FxExpression **ppFVar2;
  BYTE BVar3;
  PString *pPVar4;
  int iVar5;
  FxExpression *pFVar6;
  undefined4 extraout_var;
  FxBoolCast *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  FxExpression **ppFVar7;
  FScriptPosition *pFVar8;
  FxExpression **ppFVar9;
  ExpVal condval;
  FString local_38;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->WhenFalse == (FxExpression *)0x0 && this->WhenTrue == (FxExpression *)0x0) {
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    pFVar8 = &(this->super_FxExpression).ScriptPosition;
    FScriptPosition::Message(pFVar8,0,"empty if statement");
    pFVar6 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x28);
    pFVar6->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition(&pFVar6->ScriptPosition,pFVar8);
    pFVar6->ValueType = (PType *)0x0;
    pFVar6->ExprType = EFX_Nop;
    pFVar6->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070de78;
    pFVar6->isresolved = true;
    pFVar6->NeedResult = true;
    return pFVar6;
  }
  if (this->Condition == (FxExpression *)0x0) {
LAB_00537412:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  iVar5 = (*this->Condition->_vptr_FxExpression[2])();
  pFVar6 = (FxExpression *)CONCAT44(extraout_var,iVar5);
  this->Condition = pFVar6;
  if (pFVar6 == (FxExpression *)0x0) goto LAB_00537412;
  if (pFVar6->ValueType != (PType *)TypeBool) {
    this_00 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar6 = this->Condition;
    (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition
              (&(this_00->super_FxExpression).ScriptPosition,&pFVar6->ScriptPosition);
    (this_00->super_FxExpression).isresolved = false;
    (this_00->super_FxExpression).NeedResult = true;
    (this_00->super_FxExpression).ExprType = EFX_BoolCast;
    (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxBoolCast_0070b548;
    this_00->basex = pFVar6;
    (this_00->super_FxExpression).ValueType = (PType *)TypeBool;
    this_00->NeedValue = false;
    this->Condition = (FxExpression *)this_00;
    pFVar6 = FxBoolCast::Resolve(this_00,ctx);
    this->Condition = pFVar6;
    if (pFVar6 == (FxExpression *)0x0) goto LAB_00537412;
  }
  ppFVar1 = &this->WhenTrue;
  pFVar6 = *ppFVar1;
  if (pFVar6 != (FxExpression *)0x0) {
    iVar5 = (*pFVar6->_vptr_FxExpression[2])(pFVar6,ctx);
    *ppFVar1 = (FxExpression *)CONCAT44(extraout_var_00,iVar5);
    if ((FxExpression *)CONCAT44(extraout_var_00,iVar5) == (FxExpression *)0x0) goto LAB_00537412;
  }
  ppFVar2 = &this->WhenFalse;
  pFVar6 = *ppFVar2;
  if (pFVar6 != (FxExpression *)0x0) {
    iVar5 = (*pFVar6->_vptr_FxExpression[2])(pFVar6,ctx);
    *ppFVar2 = (FxExpression *)CONCAT44(extraout_var_01,iVar5);
    if ((FxExpression *)CONCAT44(extraout_var_01,iVar5) == (FxExpression *)0x0) goto LAB_00537412;
  }
  (this->super_FxExpression).ValueType = &TypeVoid->super_PType;
  iVar5 = (*this->Condition->_vptr_FxExpression[3])();
  if ((char)iVar5 == '\0') {
    return &this->super_FxExpression;
  }
  pPVar4 = (PString *)this->Condition[1]._vptr_FxExpression;
  pFVar8 = &this->Condition[1].ScriptPosition;
  if (pPVar4 == TypeString) {
    FString::AttachToOther(&local_38,&pFVar8->FileName);
  }
  else {
    local_38.Chars = (pFVar8->FileName).Chars;
  }
  BVar3 = (pPVar4->super_PBasicType).super_PType.RegType;
  ppFVar7 = ppFVar2;
  ppFVar9 = ppFVar1;
  if (BVar3 == '\x01') {
    if (((double)local_38.Chars == 0.0) && (!NAN((double)local_38.Chars))) goto LAB_0053746e;
  }
  else if ((BVar3 != '\0') || ((int)local_38.Chars == 0)) goto LAB_0053746e;
  ppFVar7 = ppFVar1;
  ppFVar9 = ppFVar2;
LAB_0053746e:
  pFVar6 = *ppFVar7;
  if (*ppFVar9 != (FxExpression *)0x0) {
    (*(*ppFVar9)->_vptr_FxExpression[1])();
  }
  *ppFVar1 = (FxExpression *)0x0;
  this->WhenFalse = (FxExpression *)0x0;
  if (pFVar6 == (FxExpression *)0x0) {
    pFVar6 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x28);
    pFVar6->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition
              (&pFVar6->ScriptPosition,&(this->super_FxExpression).ScriptPosition);
    pFVar6->ValueType = (PType *)0x0;
    pFVar6->ExprType = EFX_Nop;
    pFVar6->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070de78;
    pFVar6->isresolved = true;
    pFVar6->NeedResult = true;
  }
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  if (pPVar4 != TypeString) {
    return pFVar6;
  }
  FString::~FString(&local_38);
  return pFVar6;
}

Assistant:

FxExpression *FxIfStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();

	if (WhenTrue == nullptr && WhenFalse == nullptr)
	{ // We don't do anything either way, so disappear
		delete this;
		ScriptPosition.Message(MSG_WARNING, "empty if statement");
		return new FxNop(ScriptPosition);
	}

	SAFE_RESOLVE(Condition, ctx);

	if (Condition->ValueType != TypeBool)
	{
		Condition = new FxBoolCast(Condition, false);
		SAFE_RESOLVE(Condition, ctx);
	}

	if (WhenTrue != nullptr)
	{
		WhenTrue = WhenTrue->Resolve(ctx);
		ABORT(WhenTrue);
	}
	if (WhenFalse != nullptr)
	{
		WhenFalse = WhenFalse->Resolve(ctx);
		ABORT(WhenFalse);
	}

	ValueType = TypeVoid;

	if (Condition->isConstant())
	{
		ExpVal condval = static_cast<FxConstant *>(Condition)->GetValue();
		bool result = condval.GetBool();

		FxExpression *e = result ? WhenTrue : WhenFalse;
		delete (result ? WhenFalse : WhenTrue);
		WhenTrue = WhenFalse = nullptr;
		if (e == nullptr) e = new FxNop(ScriptPosition);	// create a dummy if this statement gets completely removed by optimizing out the constant parts.
		delete this;
		return e;
	}

	return this;
}